

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cbor.hpp
# Opt level: O0

type jsoncons::cbor::
     encode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               cbor_encode_options *options)

{
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  cbor_stream_encoder encoder;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_fffffffffffffe78
  ;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffea8;
  binary_stream_sink *in_stack_fffffffffffffeb0;
  basic_json_visitor<char> *in_stack_fffffffffffffeb8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  allocator<char> *in_stack_fffffffffffffed8;
  cbor_encode_options *in_stack_fffffffffffffee0;
  binary_stream_sink *in_stack_fffffffffffffee8;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_fffffffffffffef0
  ;
  
  binary_stream_sink::binary_stream_sink(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  this = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
         &stack0xfffffffffffffebf;
  std::allocator<char>::allocator();
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_cbor_encoder
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
  binary_stream_sink::~binary_stream_sink((binary_stream_sink *)this);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>>
            (in_stack_fffffffffffffe78);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
              *)0x30b2d6);
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_cbor_encoder(this)
  ;
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_cbor(const T& j, 
                std::ostream& os, 
                const cbor_encode_options& options = cbor_encode_options())
    {
        using char_type = typename T::char_type;
        cbor_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }